

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O1

int unpack(lua_State *L)

{
  int iVar1;
  lua_Integer n;
  long n_00;
  int n_01;
  
  n = luaL_optinteger(L,2,1);
  iVar1 = lua_type(L,3);
  if (iVar1 < 1) {
    n_00 = luaL_len(L,1);
  }
  else {
    n_00 = luaL_checkinteger(L,3);
  }
  if (n_00 < n) {
    return 0;
  }
  if ((ulong)(n_00 - n) < 0x7fffffff) {
    n_01 = (int)(n_00 - n) + 1;
    iVar1 = lua_checkstack(L,n_01);
    if (iVar1 != 0) {
      if (n < n_00) {
        do {
          lua_geti(L,1,n);
          n = n + 1;
        } while (n_00 != n);
      }
      lua_geti(L,1,n_00);
      return n_01;
    }
  }
  iVar1 = luaL_error(L,"too many results to unpack");
  return iVar1;
}

Assistant:

static int unpack (lua_State *L) {
  lua_Unsigned n;
  lua_Integer i = luaL_optinteger(L, 2, 1);
  lua_Integer e = luaL_opt(L, luaL_checkinteger, 3, luaL_len(L, 1));
  if (i > e) return 0;  /* empty range */
  n = (lua_Unsigned)e - i;  /* number of elements minus 1 (avoid overflows) */
  if (n >= (unsigned int)INT_MAX  || !lua_checkstack(L, (int)(++n)))
    return luaL_error(L, "too many results to unpack");
  for (; i < e; i++) {  /* push arg[i..e - 1] (to avoid overflows) */
    lua_geti(L, 1, i);
  }
  lua_geti(L, 1, e);  /* push last element */
  return (int)n;
}